

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmNinjaTargetGenerator::ComputeFlagsForObject
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,cmSourceFile *source,
          string *language,string *config)

{
  cmLocalNinjaGenerator *pcVar1;
  cmGeneratorTarget *headTarget;
  cmTarget *this_00;
  _Base_ptr p_Var2;
  cmMakefile *pcVar3;
  pointer puVar4;
  __type _Var5;
  bool bVar6;
  string *psVar7;
  cmValue cVar8;
  iterator iVar9;
  cmFileSet *this_01;
  undefined8 uVar10;
  string *psVar11;
  pointer arch;
  cmAlphaNum *this_02;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *entry;
  pointer cge;
  pointer pbVar12;
  _Base_ptr __lhs;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_01;
  string pchSource;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  architectures;
  cmAlphaNum local_2e0;
  string file_set_type;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  fileEntries;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  undefined1 local_250 [48];
  string COMPILE_OPTIONS;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  string COMPILE_FLAGS;
  string filterArch;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  directoryEntries;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  cmGeneratorExpressionInterpreter genexInterpreter;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pchSources;
  string local_50;
  
  architectures.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  architectures.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  architectures.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pchSources._M_h._M_buckets = &pchSources._M_h._M_single_bucket;
  pchSources._M_h._M_bucket_count = 1;
  pchSources._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  pchSources._M_h._M_element_count = 0;
  pchSources._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  pchSources._M_h._M_rehash_policy._M_next_resize = 0;
  pchSources._M_h._M_single_bucket = (__node_base_ptr)0x0;
  cmGeneratorTarget::GetAppleArchs
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,config,&architectures);
  if (architectures.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      architectures.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace_back<>(&architectures);
  }
  pbVar12 = architectures.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  filterArch._M_dataplus._M_p = (pointer)&filterArch.field_2;
  filterArch._M_string_length = 0;
  filterArch.field_2._M_local_buf[0] = '\0';
  for (arch = architectures.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start; arch != pbVar12; arch = arch + 1) {
    cmGeneratorTarget::GetPchSource
              (&pchSource,(this->super_cmCommonTargetGenerator).GeneratorTarget,config,language,arch
              );
    psVar7 = cmSourceFile::GetFullPath_abi_cxx11_(source);
    _Var5 = std::operator==(&pchSource,psVar7);
    if (_Var5) {
      std::__cxx11::string::_M_assign((string *)&filterArch);
    }
    if (pchSource._M_string_length != 0) {
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&genexInterpreter,&pchSource,arch);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&pchSources,&genexInterpreter);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&genexInterpreter);
    }
    std::__cxx11::string::~string((string *)&pchSource);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cmGeneratorTarget::AddExplicitLanguageFlags
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,__return_storage_ptr__,source);
  if (__return_storage_ptr__->_M_string_length != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  cmCommonTargetGenerator::GetFlags
            ((string *)&genexInterpreter,&this->super_cmCommonTargetGenerator,language,config,
             &filterArch);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&genexInterpreter);
  bVar6 = std::operator==(language,"Fortran");
  if (bVar6) {
    cmCommonTargetGenerator::AppendFortranFormatFlags
              (&this->super_cmCommonTargetGenerator,__return_storage_ptr__,source);
    cmCommonTargetGenerator::AppendFortranPreprocessFlags
              (&this->super_cmCommonTargetGenerator,__return_storage_ptr__,source,NO);
  }
  pcVar1 = this->LocalGenerator;
  std::__cxx11::string::string((string *)&local_110,(string *)config);
  headTarget = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  std::__cxx11::string::string((string *)&local_130,(string *)language);
  cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
            (&genexInterpreter,(cmLocalGenerator *)pcVar1,&local_110,headTarget,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&COMPILE_FLAGS,"COMPILE_FLAGS",(allocator<char> *)&pchSource);
  cVar8 = cmSourceFile::GetProperty(source,&COMPILE_FLAGS);
  if (cVar8.Value != (string *)0x0) {
    pcVar1 = this->LocalGenerator;
    std::__cxx11::string::string((string *)&local_150,(string *)cVar8.Value);
    psVar7 = cmGeneratorExpressionInterpreter::Evaluate(&genexInterpreter,&local_150,&COMPILE_FLAGS)
    ;
    (*(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
              (pcVar1,__return_storage_ptr__,psVar7);
    std::__cxx11::string::~string((string *)&local_150);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&COMPILE_OPTIONS,"COMPILE_OPTIONS",(allocator<char> *)&pchSource);
  cVar8 = cmSourceFile::GetProperty(source,&COMPILE_OPTIONS);
  if (cVar8.Value != (string *)0x0) {
    pcVar1 = this->LocalGenerator;
    std::__cxx11::string::string((string *)&local_170,(string *)cVar8.Value);
    psVar7 = cmGeneratorExpressionInterpreter::Evaluate
                       (&genexInterpreter,&local_170,&COMPILE_OPTIONS);
    cmLocalGenerator::AppendCompileOptions
              ((cmLocalGenerator *)pcVar1,__return_storage_ptr__,psVar7,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_170);
  }
  if (pchSources._M_h._M_element_count != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pchSource,"SKIP_PRECOMPILE_HEADERS",(allocator<char> *)&local_2e0);
    cVar8 = cmSourceFile::GetProperty(source,&pchSource);
    std::__cxx11::string::~string((string *)&pchSource);
    if (cVar8.Value == (string *)0x0) {
      pchSource._M_dataplus._M_p = (pointer)&pchSource.field_2;
      pchSource._M_string_length = 0;
      pchSource.field_2._M_allocated_capacity =
           pchSource.field_2._M_allocated_capacity & 0xffffffffffffff00;
      psVar7 = cmSourceFile::GetFullPath_abi_cxx11_(source);
      iVar9 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&pchSources._M_h,psVar7);
      if (iVar9.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        local_250._0_8_ = local_250 + 0x10;
        local_250._8_8_ = (pointer)0x0;
        local_250[0x10] = '\0';
        cmGeneratorTarget::GetPchUseCompileOptions
                  ((string *)&local_2e0,(this->super_cmCommonTargetGenerator).GeneratorTarget,config
                   ,language,(string *)local_250);
        std::__cxx11::string::operator=((string *)&pchSource,(string *)&local_2e0);
        std::__cxx11::string::~string((string *)&local_2e0);
        this_02 = (cmAlphaNum *)local_250;
      }
      else {
        cmGeneratorTarget::GetPchCreateCompileOptions
                  ((string *)&local_2e0,(this->super_cmCommonTargetGenerator).GeneratorTarget,config
                   ,language,
                   (string *)
                   ((long)iVar9.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                          ._M_cur + 0x28));
        this_02 = &local_2e0;
        std::__cxx11::string::operator=((string *)&pchSource,(string *)this_02);
      }
      std::__cxx11::string::~string((string *)this_02);
      pcVar1 = this->LocalGenerator;
      std::__cxx11::string::string((string *)&local_190,(string *)&pchSource);
      psVar7 = cmGeneratorExpressionInterpreter::Evaluate
                         (&genexInterpreter,&local_190,&COMPILE_OPTIONS);
      cmLocalGenerator::AppendCompileOptions
                ((cmLocalGenerator *)pcVar1,__return_storage_ptr__,psVar7,(char *)0x0);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&pchSource);
    }
  }
  psVar7 = cmSourceFile::GetFullPath_abi_cxx11_(source);
  this_00 = ((this->super_cmCommonTargetGenerator).GeneratorTarget)->Target;
  file_set_type._M_dataplus._M_p = (pointer)&file_set_type.field_2;
  file_set_type._M_string_length = 0;
  file_set_type.field_2._M_local_buf[0] = '\0';
  cmTarget::GetAllFileSetNames_abi_cxx11_(&local_268,this_00);
  pbVar12 = local_268.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pbVar12 ==
        local_268.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_268);
      std::__cxx11::string::~string((string *)&file_set_type);
      std::__cxx11::string::~string((string *)&COMPILE_OPTIONS);
      std::__cxx11::string::~string((string *)&COMPILE_FLAGS);
      cmGeneratorExpressionInterpreter::~cmGeneratorExpressionInterpreter(&genexInterpreter);
      std::__cxx11::string::~string((string *)&filterArch);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&pchSources._M_h);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&architectures);
      return __return_storage_ptr__;
    }
    this_01 = cmTarget::GetFileSet(this_00,pbVar12);
    if (this_01 == (cmFileSet *)0x0) {
      pcVar3 = (this->super_cmCommonTargetGenerator).Makefile;
      pchSource._M_dataplus._M_p = (pointer)0x8;
      pchSource._M_string_length = (long)"\nTarget \"" + 1;
      psVar11 = cmTarget::GetName_abi_cxx11_(this_00);
      local_2e0.View_._M_str = (psVar11->_M_dataplus)._M_p;
      local_2e0.View_._M_len = psVar11->_M_string_length;
      cmStrCat<char[32],std::__cxx11::string,char[25]>
                ((string *)local_250,(cmAlphaNum *)&pchSource,&local_2e0,
                 (char (*) [32])"\" is tracked to have file set \"",pbVar12,
                 (char (*) [25])"\", but it was not found.");
      cmMakefile::IssueMessage(pcVar3,INTERNAL_ERROR,(string *)local_250);
      std::__cxx11::string::~string((string *)local_250);
    }
    else {
      cmFileSet::CompileFileEntries(&fileEntries,this_01);
      cmFileSet::CompileDirectoryEntries(&directoryEntries,this_01);
      cmFileSet::EvaluateDirectoryEntries
                (&directories,this_01,&directoryEntries,(cmLocalGenerator *)this->LocalGenerator,
                 config,(this->super_cmCommonTargetGenerator).GeneratorTarget,
                 (cmGeneratorExpressionDAGChecker *)0x0);
      puVar4 = fileEntries.
               super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pchSource._M_string_length = pchSource._M_string_length & 0xffffffff00000000;
      pchSource.field_2._M_allocated_capacity = 0;
      pchSource.field_2._8_8_ = &pchSource._M_string_length;
      for (cge = fileEntries.
                 super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; uVar10 = pchSource.field_2._8_8_,
          cge != puVar4; cge = cge + 1) {
        cmFileSet::EvaluateFileEntry
                  (this_01,&directories,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    *)&pchSource,cge,(cmLocalGenerator *)this->LocalGenerator,config,
                   (this->super_cmCommonTargetGenerator).GeneratorTarget,
                   (cmGeneratorExpressionDAGChecker *)0x0);
      }
      for (; (size_type *)uVar10 != &pchSource._M_string_length;
          uVar10 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar10)) {
        __lhs = *(_Base_ptr *)(uVar10 + 0x40);
        p_Var2 = ((_Rb_tree_node_base *)(uVar10 + 0x40))->_M_parent;
        do {
          if (__lhs == p_Var2) goto LAB_0029317d;
          _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs,psVar7);
          __lhs = __lhs + 1;
        } while (!_Var5);
        std::__cxx11::string::_M_assign((string *)&file_set_type);
LAB_0029317d:
      }
      __y._M_str = "CXX_MODULES";
      __y._M_len = 0xb;
      __x._M_str = file_set_type._M_dataplus._M_p;
      __x._M_len = file_set_type._M_string_length;
      bVar6 = std::operator==(__x,__y);
      if ((bVar6) ||
         (__y_00._M_str = "CXX_MODULE_HEADER_UNITS", __y_00._M_len = 0x17,
         __x_00._M_str = file_set_type._M_dataplus._M_p,
         __x_00._M_len = file_set_type._M_string_length, bVar6 = std::operator==(__x_00,__y_00),
         bVar6)) {
        cmSourceFile::GetLanguage_abi_cxx11_((string *)&local_2e0,source);
        __y_01._M_str = "CXX";
        __y_01._M_len = 3;
        __x_01._M_str = (char *)local_2e0.View_._M_len;
        __x_01._M_len = (size_t)local_2e0.View_._M_str;
        bVar6 = std::operator!=(__x_01,__y_01);
        std::__cxx11::string::~string((string *)&local_2e0);
        if (bVar6) {
          pcVar3 = (this->super_cmCommonTargetGenerator).Makefile;
          local_2e0.View_._M_len = 8;
          local_2e0.View_._M_str = "Target \"";
          psVar11 = cmTarget::GetName_abi_cxx11_(this_00);
          local_250._8_8_ = (psVar11->_M_dataplus)._M_p;
          local_250._0_8_ = psVar11->_M_string_length;
          cmStrCat<char[25],std::__cxx11::string,char[25],std::__cxx11::string,char[54]>
                    (&local_50,&local_2e0,(cmAlphaNum *)local_250,
                     (char (*) [25])"\" contains the source\n  ",psVar7,
                     (char (*) [25])"\nin a file set of type \"",&file_set_type,
                     (char (*) [54])"\" but the source is not classified as a \"CXX\" source.");
          cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)&pchSource);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&directories);
      std::
      vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
      ::~vector(&directoryEntries);
      std::
      vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
      ::~vector(&fileEntries);
    }
    pbVar12 = pbVar12 + 1;
  } while( true );
}

Assistant:

std::string cmNinjaTargetGenerator::ComputeFlagsForObject(
  cmSourceFile const* source, const std::string& language,
  const std::string& config)
{
  std::vector<std::string> architectures;
  std::unordered_map<std::string, std::string> pchSources;
  this->GeneratorTarget->GetAppleArchs(config, architectures);
  if (architectures.empty()) {
    architectures.emplace_back();
  }

  std::string filterArch;
  for (const std::string& arch : architectures) {
    const std::string pchSource =
      this->GeneratorTarget->GetPchSource(config, language, arch);
    if (pchSource == source->GetFullPath()) {
      filterArch = arch;
    }
    if (!pchSource.empty()) {
      pchSources.insert(std::make_pair(pchSource, arch));
    }
  }

  std::string flags;
  // Explicitly add the explicit language flag before any other flag
  // so user flags can override it.
  this->GeneratorTarget->AddExplicitLanguageFlags(flags, *source);

  if (!flags.empty()) {
    flags += " ";
  }
  flags += this->GetFlags(language, config, filterArch);

  // Add Fortran format flags.
  if (language == "Fortran") {
    this->AppendFortranFormatFlags(flags, *source);
    this->AppendFortranPreprocessFlags(flags, *source,
                                       PreprocessFlagsRequired::NO);
  }

  // Add source file specific flags.
  cmGeneratorExpressionInterpreter genexInterpreter(
    this->LocalGenerator, config, this->GeneratorTarget, language);

  const std::string COMPILE_FLAGS("COMPILE_FLAGS");
  if (cmValue cflags = source->GetProperty(COMPILE_FLAGS)) {
    this->LocalGenerator->AppendFlags(
      flags, genexInterpreter.Evaluate(*cflags, COMPILE_FLAGS));
  }

  const std::string COMPILE_OPTIONS("COMPILE_OPTIONS");
  if (cmValue coptions = source->GetProperty(COMPILE_OPTIONS)) {
    this->LocalGenerator->AppendCompileOptions(
      flags, genexInterpreter.Evaluate(*coptions, COMPILE_OPTIONS));
  }

  // Add precompile headers compile options.
  if (!pchSources.empty() && !source->GetProperty("SKIP_PRECOMPILE_HEADERS")) {
    std::string pchOptions;
    auto pchIt = pchSources.find(source->GetFullPath());
    if (pchIt != pchSources.end()) {
      pchOptions = this->GeneratorTarget->GetPchCreateCompileOptions(
        config, language, pchIt->second);
    } else {
      pchOptions =
        this->GeneratorTarget->GetPchUseCompileOptions(config, language);
    }

    this->LocalGenerator->AppendCompileOptions(
      flags, genexInterpreter.Evaluate(pchOptions, COMPILE_OPTIONS));
  }

  auto const& path = source->GetFullPath();
  auto const* tgt = this->GeneratorTarget->Target;

  std::string file_set_type;

  for (auto const& name : tgt->GetAllFileSetNames()) {
    auto const* file_set = tgt->GetFileSet(name);
    if (!file_set) {
      this->GetMakefile()->IssueMessage(
        MessageType::INTERNAL_ERROR,
        cmStrCat("Target \"", tgt->GetName(),
                 "\" is tracked to have file set \"", name,
                 "\", but it was not found."));
      continue;
    }

    auto fileEntries = file_set->CompileFileEntries();
    auto directoryEntries = file_set->CompileDirectoryEntries();
    auto directories = file_set->EvaluateDirectoryEntries(
      directoryEntries, this->LocalGenerator, config, this->GeneratorTarget);

    std::map<std::string, std::vector<std::string>> files;
    for (auto const& entry : fileEntries) {
      file_set->EvaluateFileEntry(directories, files, entry,
                                  this->LocalGenerator, config,
                                  this->GeneratorTarget);
    }

    for (auto const& it : files) {
      for (auto const& filename : it.second) {
        if (filename == path) {
          file_set_type = file_set->GetType();
          break;
        }
      }
    }

    if (file_set_type == "CXX_MODULES"_s ||
        file_set_type == "CXX_MODULE_HEADER_UNITS"_s) {
      if (source->GetLanguage() != "CXX"_s) {
        this->GetMakefile()->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat(
            "Target \"", tgt->GetName(), "\" contains the source\n  ", path,
            "\nin a file set of type \"", file_set_type,
            R"(" but the source is not classified as a "CXX" source.)"));
        continue;
      }
    }
  }

  return flags;
}